

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O0

int FmsIOBuildFmsDataCollection(FmsIODataCollectionInfo *dc_info,FmsDataCollection *dc)

{
  ulong uVar1;
  int iVar2;
  FmsInt order;
  long lVar3;
  undefined8 *in_RSI;
  long in_RDI;
  FmsMetaData md_1;
  char *field_name;
  FmsField field_1;
  FmsField *fields;
  FmsInt j_6;
  FmsComponent comp_3;
  FmsIOComponentInfo *cinfo;
  FmsInt i_5;
  FmsMetaData md;
  FmsFieldDescriptor fd_1;
  char *fd_name;
  FmsFieldDescriptor *fds;
  FmsInt j_5;
  FmsField field;
  FmsIOFieldInfo *finfo;
  FmsInt i_4;
  FmsInt nfields;
  FmsComponent comp_2;
  char *comp_name_1;
  FmsInt j_4;
  FmsFieldDescriptor fd;
  FmsIOFieldDescriptorInfo *fd_info;
  FmsInt i_3;
  FmsInt nfds;
  char *comp_name;
  FmsComponent comp_1;
  FmsInt j_3;
  FmsTag tag;
  FmsIOTagInfo *tinfo;
  FmsInt i_2;
  FmsInt ntags;
  FmsInt j_2;
  FmsInt nrelations;
  FmsIOEntityInfo *seinfo;
  FmsInt k_1;
  FmsIOEntityInfo *einfo_1;
  FmsInt part_id;
  FmsDomain dom;
  FmsDomain *doms_1;
  FmsIOComponentPartInfo *pinfo;
  FmsInt j_1;
  FmsInt nparts;
  FmsIOComponentInfo *comp_info;
  FmsComponent comp;
  FmsInt i_1;
  FmsInt ncomponents;
  FmsIOEntityInfo *einfo;
  FmsInt dim;
  FmsIODomainInfo *dinfo;
  FmsInt k;
  FmsDomain *doms;
  FmsInt ndoms;
  FmsInt j;
  FmsInt i;
  FmsInt ndomnames;
  FmsMesh mesh;
  int err;
  FmsMesh *in_stack_fffffffffffffdf8;
  FmsMetaData *in_stack_fffffffffffffe00;
  FmsMesh in_stack_fffffffffffffe08;
  FmsDomain **in_stack_fffffffffffffe10;
  FmsComponent in_stack_fffffffffffffe18;
  FmsDomain in_stack_fffffffffffffe20;
  FmsIOMetaDataInfo *minfo;
  FmsDomain in_stack_fffffffffffffe28;
  char **in_stack_fffffffffffffe30;
  FmsField field_00;
  FmsComponent in_stack_fffffffffffffe38;
  FmsField *ppFVar4;
  FmsDomain in_stack_fffffffffffffe40;
  ulong uVar5;
  FmsComponent in_stack_fffffffffffffe48;
  FmsOrientation *in_stack_fffffffffffffe50;
  FmsDomain in_stack_fffffffffffffe58;
  ulong comp_id;
  void *in_stack_fffffffffffffe60;
  FmsInt in_stack_fffffffffffffe68;
  char *local_190;
  FmsMesh in_stack_fffffffffffffe78;
  FmsFieldDescriptor local_180;
  ulong local_168;
  FmsComponent local_158;
  char *local_150;
  ulong local_148;
  FmsFieldDescriptor local_140;
  FmsFieldDescriptor pFVar6;
  FmsFieldDescriptor fd_00;
  char *local_120;
  FmsComponent local_118;
  ulong local_110;
  FmsTag local_108;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  uint *local_c8;
  undefined8 local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong *local_60;
  ulong local_58;
  long local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  FmsMesh local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  long local_10;
  int local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else if (in_RSI == (undefined8 *)0x0) {
    local_4 = 2;
  }
  else if (*(long *)(in_RDI + 0x28) == 0) {
    local_4 = 3;
  }
  else {
    local_1c = 0;
    local_28 = (FmsMesh)0x0;
    local_18 = in_RSI;
    local_10 = in_RDI;
    FmsMeshConstruct(in_stack_fffffffffffffdf8);
    local_30 = *(ulong *)(*(long *)(local_10 + 0x28) + 8);
    if (local_30 != 0) {
      for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
        local_48 = *(ulong *)(*(long *)(*(long *)(local_10 + 0x28) + 0x20) + local_38 * 0x18 + 8);
        local_50 = 0;
        FmsMeshAddDomains((FmsMesh)in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                          (FmsInt)in_stack_fffffffffffffe48,(FmsDomain **)in_stack_fffffffffffffe40)
        ;
        for (local_40 = 0; local_40 < local_48; local_40 = local_40 + 1) {
          local_58 = 0;
          local_60 = (ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x28) + 0x20) +
                                         local_38 * 0x18 + 0x10) + local_40 * 0x18);
          local_68 = *local_60;
          FmsDomainSetNumVertices(*(FmsDomain *)(local_50 + local_40 * 8),local_60[1]);
          for (local_58 = 0; local_58 < local_68; local_58 = local_58 + 1) {
            local_70 = local_60[2] + local_58 * 0x28;
            FmsDomainSetNumEntities
                      (in_stack_fffffffffffffe28,
                       (FmsEntityType)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                       (FmsIntType)in_stack_fffffffffffffe20,(FmsInt)in_stack_fffffffffffffe18);
            FmsDomainAddEntities
                      (in_stack_fffffffffffffe58,
                       (FmsEntityType)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                       (int **)in_stack_fffffffffffffe48,
                       (FmsIntType)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                       in_stack_fffffffffffffe38,(FmsInt)in_stack_fffffffffffffe30);
          }
        }
      }
    }
    local_78 = *(ulong *)(*(long *)(local_10 + 0x28) + 0x10);
    if (local_78 != 0) {
      for (local_80 = 0; local_80 < local_78; local_80 = local_80 + 1) {
        local_90 = *(long *)(*(long *)(local_10 + 0x28) + 0x28) + local_80 * 0x48;
        FmsMeshAddComponent((FmsMesh)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                            (FmsComponent *)in_stack_fffffffffffffe18);
        local_98 = *(ulong *)(local_90 + 0x20);
        for (local_a0 = 0; local_a0 < local_98; local_a0 = local_a0 + 1) {
          local_a8 = *(long *)(local_90 + 0x28) + local_a0 * 0x160;
          iVar2 = FmsMeshGetDomainsByName
                            ((FmsMesh)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                             (FmsInt *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
          if (iVar2 != 0) {
            return 4;
          }
          local_b8 = *(undefined8 *)(local_b0 + *(long *)(local_a8 + 8) * 8);
          if (*(long *)(local_a8 + 0x10) == 0) {
            FmsComponentAddPart((FmsComponent)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                                (FmsInt *)in_stack_fffffffffffffe18);
            local_c8 = (uint *)(local_a8 + 0x20 + (ulong)*(uint *)(local_a8 + 0x18) * 0x28);
            in_stack_fffffffffffffe00 = *(FmsMetaData **)(local_c8 + 8);
            in_stack_fffffffffffffe10 = *(FmsDomain ***)(local_c8 + 2);
            in_stack_fffffffffffffdf8 = (FmsMesh *)0x0;
            in_stack_fffffffffffffe08 = (FmsMesh)0x0;
            FmsComponentAddPartEntities
                      (in_stack_fffffffffffffe38,(FmsInt)in_stack_fffffffffffffe30,
                       (FmsEntityType)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                       (FmsIntType)in_stack_fffffffffffffe28,
                       (FmsIntType)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                       (FmsIntType)in_stack_fffffffffffffe20,in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68
                      );
            for (local_d0 = 0; local_d0 < *local_c8; local_d0 = local_d0 + 1) {
              local_d8 = local_a8 + 0x20 + local_d0 * 0x28;
              if (*(long *)(local_d8 + 8) != 0) {
                in_stack_fffffffffffffdf8 = *(FmsMesh **)(local_d8 + 8);
                FmsComponentAddPartSubEntities
                          (in_stack_fffffffffffffe38,(FmsInt)in_stack_fffffffffffffe30,
                           (FmsEntityType)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                           (FmsIntType)in_stack_fffffffffffffe28,
                           (FmsIntType)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                           in_stack_fffffffffffffe18,(FmsInt)in_stack_fffffffffffffe50);
              }
            }
          }
          else {
            FmsComponentAddDomain(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
          }
        }
        local_e0 = *(ulong *)(local_90 + 0x30);
        if (local_e0 != 0) {
          for (local_e8 = 0; local_e8 < local_e0; local_e8 = local_e8 + 1) {
            FmsComponentAddRelation(in_stack_fffffffffffffe18,(FmsInt)in_stack_fffffffffffffe10);
          }
        }
      }
    }
    local_f0 = *(ulong *)(*(long *)(local_10 + 0x28) + 0x18);
    if (local_f0 != 0) {
      for (local_f8 = 0; local_f8 < local_f0; local_f8 = local_f8 + 1) {
        local_100 = *(long *)(*(long *)(local_10 + 0x28) + 0x30) + local_f8 * 0x40;
        local_108 = (FmsTag)0x0;
        FmsMeshAddTag((FmsMesh)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                      (FmsTag *)in_stack_fffffffffffffe18);
        for (local_110 = 0; local_110 < local_78; local_110 = local_110 + 1) {
          local_120 = (char *)0x0;
          FmsMeshGetComponent(local_28,local_110,&local_118);
          FmsComponentGetName(local_118,&local_120);
          iVar2 = strcmp(local_120,*(char **)(local_100 + 8));
          if (iVar2 == 0) {
            FmsTagSetComponent(local_108,local_118);
            break;
          }
        }
        FmsTagSet((FmsTag)in_stack_fffffffffffffe18,
                  (FmsIntType)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                  (FmsIntType)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                  (FmsInt)in_stack_fffffffffffffe00);
        if (*(long *)(local_100 + 0x28) != 0) {
          FmsTagAddDescriptions
                    ((FmsTag)in_stack_fffffffffffffe48,
                     (FmsIntType)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                     (FmsInt)in_stack_fffffffffffffe28);
        }
      }
    }
    FmsMeshFinalize(local_28);
    FmsMeshValidate(in_stack_fffffffffffffe78);
    FmsDataCollectionCreate
              (in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,
               (FmsDataCollection *)in_stack_fffffffffffffdf8);
    fd_00 = *(FmsFieldDescriptor *)(local_10 + 8);
    if (fd_00 != (FmsFieldDescriptor)0x0) {
      for (pFVar6 = (FmsFieldDescriptor)0x0; pFVar6 < fd_00;
          pFVar6 = (FmsFieldDescriptor)((long)&pFVar6->name + 1)) {
        order = *(long *)(local_10 + 0x10) + (long)pFVar6 * 0x28;
        FmsDataCollectionAddFieldDescriptor
                  ((FmsDataCollection)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                   (FmsFieldDescriptor *)in_stack_fffffffffffffe18);
        for (local_148 = 0; local_148 < local_78; local_148 = local_148 + 1) {
          local_150 = (char *)0x0;
          local_158 = (FmsComponent)0x0;
          FmsMeshGetComponent(local_28,local_148,&local_158);
          FmsComponentGetName(local_158,&local_150);
          iVar2 = strcmp(local_150,*(char **)(order + 8));
          if (iVar2 == 0) {
            FmsFieldDescriptorSetComponent(local_140,local_158);
            break;
          }
        }
        FmsFieldDescriptorSetFixedOrder
                  (fd_00,(FmsFieldType)((ulong)pFVar6 >> 0x20),(FmsBasisType)pFVar6,order);
      }
    }
    uVar1 = *(ulong *)(local_10 + 0x18);
    if (uVar1 != 0) {
      for (local_168 = 0; local_168 < uVar1; local_168 = local_168 + 1) {
        lVar3 = *(long *)(local_10 + 0x20) + local_168 * 0x40;
        FmsDataCollectionAddField
                  ((FmsDataCollection)in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20,
                   (FmsField *)in_stack_fffffffffffffe18);
        FmsDataCollectionGetFieldDescriptors
                  ((FmsDataCollection)*local_18,(FmsFieldDescriptor **)&stack0xfffffffffffffe78,
                   (FmsInt *)0x0);
        for (local_180 = (FmsFieldDescriptor)0x0; local_180 < fd_00;
            local_180 = (FmsFieldDescriptor)((long)&local_180->name + 1)) {
          local_190 = (char *)0x0;
          FmsFieldDescriptorGetName
                    ((FmsFieldDescriptor)(&in_stack_fffffffffffffe78->num_domains)[(long)local_180],
                     &local_190);
          iVar2 = strcmp(local_190,*(char **)(lVar3 + 0x18));
          if (iVar2 == 0) {
            FmsFieldSet((FmsField)in_stack_fffffffffffffe28,
                        (FmsFieldDescriptor)in_stack_fffffffffffffe20,
                        (FmsInt)in_stack_fffffffffffffe18,
                        (FmsLayoutType)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                        (FmsScalarType)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
          }
        }
        if (*(long *)(lVar3 + 0x38) != 0) {
          FmsFieldAttachMetaData((FmsField)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
          FmsIOBuildFmsMetaData
                    ((FmsMetaData)in_stack_fffffffffffffe28,
                     (FmsIOMetaDataInfo *)in_stack_fffffffffffffe20);
        }
      }
    }
    if (local_78 != 0) {
      for (comp_id = 0; comp_id < local_78; comp_id = comp_id + 1) {
        lVar3 = *(long *)(*(long *)(local_10 + 0x28) + 0x28) + comp_id * 0x48;
        if (*(long *)(lVar3 + 0x18) != 0) {
          FmsMeshGetComponent(local_28,comp_id,(FmsComponent *)&stack0xfffffffffffffe48);
          ppFVar4 = (FmsField *)0x0;
          FmsDataCollectionGetFields
                    ((FmsDataCollection)*local_18,(FmsField **)&stack0xfffffffffffffe38,
                     (FmsInt *)0x0);
          for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
            field_00 = ppFVar4[uVar5];
            in_stack_fffffffffffffe28 = (FmsDomain)0x0;
            FmsFieldGetName(field_00,(char **)&stack0xfffffffffffffe28);
            iVar2 = strcmp((char *)in_stack_fffffffffffffe28,*(char **)(lVar3 + 0x18));
            if (iVar2 == 0) {
              FmsComponentSetCoordinates(in_stack_fffffffffffffe48,field_00);
              break;
            }
          }
        }
      }
    }
    if (*(long *)(local_10 + 0x30) != 0) {
      minfo = (FmsIOMetaDataInfo *)0x0;
      FmsDataCollectionAttachMetaData
                ((FmsDataCollection)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      FmsIOBuildFmsMetaData((FmsMetaData)in_stack_fffffffffffffe28,minfo);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
FmsIOBuildFmsDataCollection(FmsIODataCollectionInfo *dc_info,
                            FmsDataCollection *dc) {
  if(!dc_info) E_RETURN(1);
  if(!dc) E_RETURN(2);
  if(!dc_info->mesh_info)
    E_RETURN(3);

  int err = 0;
  FmsMesh mesh = NULL;
  FmsMeshConstruct(&mesh);

  // Populate mesh domains
  const FmsInt ndomnames = dc_info->mesh_info->ndomain_names;
  if(ndomnames) {
    FmsInt i;
    for(i = 0; i < ndomnames; i++) {
      FmsInt j;
      FmsInt ndoms = dc_info->mesh_info->domain_names[i].ndomains;
      FmsDomain *doms = NULL;
      FmsMeshAddDomains(mesh, dc_info->mesh_info->domain_names[i].name, ndoms, &doms);
      for(j = 0; j < ndoms; j++) {
        FmsInt k = 0;
        FmsIODomainInfo *dinfo = &dc_info->mesh_info->domain_names[i].domains[j];
        const FmsInt dim = dinfo->dim;
        FmsDomainSetNumVertices(doms[j], dinfo->nverts);
        for(k = 0; k < dim; k++) {
          FmsIOEntityInfo *einfo = &dinfo->entities[k];
          FmsDomainSetNumEntities(doms[j], einfo->ent_type, einfo->type, einfo->nents);
          FmsDomainAddEntities(doms[j], einfo->ent_type, NULL, einfo->type, einfo->values,
                               einfo->nents);
        }
      }
    }
  }

  // Populate mesh components
  const FmsInt ncomponents = dc_info->mesh_info->ncomponents;
  if(ncomponents) {
    FmsInt i;
    for(i = 0; i < ncomponents; i++) {
      FmsComponent comp;
      FmsIOComponentInfo *comp_info = &dc_info->mesh_info->components[i];
      FmsMeshAddComponent(mesh, comp_info->name, &comp);
      // TODO: Add Coordinates if they exist? How can I do that if I can't make fields yet. There is no AddCoordinates function
      const FmsInt nparts = comp_info->nparts;
      FmsInt j;
      for(j = 0; j < nparts; j++) {
        FmsIOComponentPartInfo *pinfo = &comp_info->parts[j];
        // Lookup domain
        FmsDomain *doms;
        if(FmsMeshGetDomainsByName(mesh, pinfo->domain_name, NULL, &doms))
          E_RETURN(4); // Failed to lookup the mesh off id & name
        FmsDomain dom = doms[pinfo->domain_id];
        if(pinfo->full_domain) {
          FmsComponentAddDomain(comp, dom);
          continue;
        } else {
          FmsInt part_id;
          FmsComponentAddPart(comp, dom, &part_id);
          FmsIOEntityInfo *einfo = &pinfo->entities[pinfo->part_ent_type];
          FmsComponentAddPartEntities(comp, part_id, einfo->ent_type,
                                      einfo->type, einfo->type, FMS_INT32, NULL, einfo->values, NULL, einfo->nents);
          FmsInt k;
          for(k = 0; k < einfo->ent_type; k++) {
            FmsIOEntityInfo *seinfo = &pinfo->entities[k];
            if(!seinfo->nents) continue;
            FmsComponentAddPartSubEntities(comp, part_id, seinfo->ent_type, seinfo->type,
                                           seinfo->type, seinfo->values, seinfo->nents);
          }
        }
      }
      // Add the component relations
      const FmsInt nrelations = comp_info->relation_size;
      if(nrelations) {
        FmsInt j;
        for(j = 0; j < nrelations; j++) {
          FmsComponentAddRelation(comp, comp_info->relation_values[j]);
        }
      }
    }
  }

  // Populate mesh tags
  const FmsInt ntags = dc_info->mesh_info->ntags;
  if(ntags) {
    FmsInt i;
    for(i = 0; i < ntags; i++) {
      FmsIOTagInfo *tinfo = &dc_info->mesh_info->tags[i];
      FmsTag tag = NULL;
      FmsMeshAddTag(mesh, tinfo->name, &tag);
      // Lookup component
      FmsInt j;
      for(j = 0; j < ncomponents; j++) {
        FmsComponent comp;
        const char *comp_name = NULL;
        FmsMeshGetComponent(mesh, j, &comp);
        FmsComponentGetName(comp, &comp_name);
        if(strcmp(comp_name, tinfo->comp_name) == 0) {
          FmsTagSetComponent(tag, comp);
          break;
        }
      }
      FmsTagSet(tag, tinfo->type, tinfo->type, tinfo->values, tinfo->size);
      if(tinfo->descr_size) {
        FmsTagAddDescriptions(tag, tinfo->type, tinfo->tag_values, tinfo->descriptions,
                              tinfo->descr_size);
      }
    }
  }

  // Finalize our mesh
  FmsMeshFinalize(mesh);
  FmsMeshValidate(mesh);

  // Start building the data collection and adding the fields
  FmsDataCollectionCreate(mesh, dc_info->name, dc);

  // Add FieldDescriptors
  const FmsInt nfds = dc_info->nfds;
  if(nfds) {
    FmsInt i;
    for(i = 0; i < nfds; i++) {
      FmsIOFieldDescriptorInfo *fd_info = &dc_info->fds[i];
      FmsFieldDescriptor fd;
      FmsDataCollectionAddFieldDescriptor(*dc, fd_info->name, &fd);
      // Lookup Component by name
      FmsInt j;
      for(j = 0; j < ncomponents; j++) {
        const char *comp_name = NULL;
        FmsComponent comp = NULL;
        FmsMeshGetComponent(mesh, j, &comp);
        FmsComponentGetName(comp, &comp_name);
        if(strcmp(comp_name, fd_info->component_name) == 0) {
          FmsFieldDescriptorSetComponent(fd, comp);
          break;
        }
      }
      FmsFieldDescriptorSetFixedOrder(fd, (FmsFieldType)fd_info->fixed_order[0],
                                      (FmsBasisType)fd_info->fixed_order[1],
                                      fd_info->fixed_order[2]);
      // TODO: Check ndofs & type against what was serialized?
    }
  }

  const FmsInt nfields = dc_info->nfields;
  if(nfields) {
    FmsInt i;
    for(i = 0; i < nfields; i++) {
      FmsIOFieldInfo *finfo = &dc_info->fields[i];
      FmsField field = NULL;
      FmsDataCollectionAddField(*dc, finfo->name, &field);
      // Lookup FieldDescriptor by name
      FmsInt j;
      FmsFieldDescriptor *fds;
      FmsDataCollectionGetFieldDescriptors(*dc, &fds, NULL);
      for(j = 0; j < nfds; j++) {
        const char *fd_name = NULL;
        FmsFieldDescriptor fd = fds[j];
        FmsFieldDescriptorGetName(fd, &fd_name);
        if(strcmp(fd_name, finfo->fd_name) == 0) {
          FmsFieldSet(field, fd, finfo->num_vec_comps, finfo->layout, finfo->data_type,
                      finfo->data);
        }
      }
      if(finfo->md) {
        FmsMetaData md = NULL;
        FmsFieldAttachMetaData(field, &md);
        FmsIOBuildFmsMetaData(md, finfo->md);
      }
    }
  }

  // Now that we have everything setup we have to go back and add coordinates to components that need them
  if(ncomponents) {
    FmsInt i;
    for(i = 0; i < ncomponents; i++) {
      FmsIOComponentInfo *cinfo = &dc_info->mesh_info->components[i];
      // If this component doesn't have coordinates just skip it
      if(!cinfo->coordinates_name)
        continue;
      FmsComponent comp;
      FmsMeshGetComponent(mesh, i, &comp);
      // Lookup Coordinate field by name
      FmsInt j;
      FmsField *fields = NULL;
      FmsDataCollectionGetFields(*dc, &fields, NULL);
      for(j = 0; j < nfields; j++) {
        FmsField field = fields[j];
        const char *field_name = NULL;
        FmsFieldGetName(field, &field_name);
        if(strcmp(field_name, cinfo->coordinates_name) == 0) {
          FmsComponentSetCoordinates(comp, field);
          break;
        }
      }
    }
  }

  // If we have MetaData attach it
  if(dc_info->md) {
    FmsMetaData md = NULL;
    FmsDataCollectionAttachMetaData(*dc, &md);
    err = FmsIOBuildFmsMetaData(md, dc_info->md);
    (void)err; // TODO: error handling
  }

  return 0;
}